

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveDefineArea(Parser *parser,int flags)

{
  pointer pEVar1;
  bool bVar2;
  CDirectiveArea *this;
  byte in_DL;
  undefined4 in_register_00000034;
  vector<Expression,_std::allocator<Expression>_> parameters;
  vector<Expression,_std::allocator<Expression>_> local_38;
  
  local_38.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (Expression *)0x0;
  local_38.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = Parser::parseExpressionList((Parser *)CONCAT44(in_register_00000034,flags),&local_38,2,3);
  pEVar1 = local_38.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar2) {
    this = (CDirectiveArea *)operator_new(0x90);
    CDirectiveArea::CDirectiveArea(this,(bool)(in_DL & 1),pEVar1 + 1);
    CDirectiveArea::setPositionExpression
              (this,local_38.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                    super__Vector_impl_data._M_start);
    if ((long)local_38.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_38.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_start == 0x48) {
      CDirectiveArea::setFillExpression
                (this,local_38.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                      super__Vector_impl_data._M_start + 2);
    }
  }
  else {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    this = (CDirectiveArea *)0x0;
  }
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this;
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&local_38);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveDefineArea(Parser& parser, int flags)
{
	std::vector<Expression> parameters;
	if (!parser.parseExpressionList(parameters,2,3))
		return nullptr;

	bool shared = (flags & DIRECTIVE_AREA_SHARED) != 0;
	auto area = std::make_unique<CDirectiveArea>(shared, parameters[1]);
	area->setPositionExpression(parameters[0]);
	if (parameters.size() == 3)
		area->setFillExpression(parameters[2]);

	return area;
}